

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int hex_decode(JSContext *ctx,JSString *p,int k)

{
  int iVar1;
  int in_EDX;
  JSString *in_RSI;
  JSContext *in_RDI;
  int c;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  if ((in_EDX < (int)((uint)*(undefined8 *)&in_RSI->field_0x4 & 0x7fffffff)) &&
     (iVar1 = string_get(in_RSI,in_EDX), iVar1 == 0x25)) {
    if (((int)((uint)*(undefined8 *)&in_RSI->field_0x4 & 0x7fffffff) <= in_EDX + 2) ||
       (local_4 = string_get_hex(in_RSI,in_EDX,in_stack_ffffffffffffffe0), local_4 < 0)) {
      local_4 = js_throw_URIError(in_RDI,"expecting hex digit");
    }
  }
  else {
    local_4 = js_throw_URIError(in_RDI,"expecting %%");
  }
  return local_4;
}

Assistant:

static int hex_decode(JSContext *ctx, JSString *p, int k) {
    int c;

    if (k >= p->len || string_get(p, k) != '%')
        return js_throw_URIError(ctx, "expecting %%");
    if (k + 2 >= p->len || (c = string_get_hex(p, k + 1, 2)) < 0)
        return js_throw_URIError(ctx, "expecting hex digit");

    return c;
}